

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reshape.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeReshape(ConvertLayerParameters layerParameters)

{
  RepeatedField<unsigned_long> *this;
  int iVar1;
  Rep *pRVar2;
  string *psVar3;
  string *psVar4;
  ConvolutionLayerParams *pCVar5;
  Arena *pAVar6;
  unsigned_long uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  Type *pTVar11;
  Type *pTVar12;
  BlobShape *pBVar13;
  LogMessage *pLVar14;
  ReshapeLayerParams *this_00;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  ReshapeParameter *pRVar21;
  long lVar22;
  ulong __val;
  void **ppvVar23;
  long in_stack_00000008;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  undefined1 local_248 [63];
  LogFinisher local_209;
  Type *local_208;
  undefined1 local_200 [56];
  ReshapeParameter *local_1c8;
  Type *local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),
                       *(int *)__str._M_dataplus._M_p);
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  if (((pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar11->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_248._0_8_ = local_248 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"Must have 1 input and 1 output","");
    errorInCaffeProto((string *)local_248,(pTVar11->name_).ptr_,(pTVar11->type_).ptr_);
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
  }
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar11->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar23 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar23 = (void **)0x0;
  }
  lVar22 = (long)(pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_;
  local_208 = pTVar11;
  local_1c0 = pTVar12;
  if (lVar22 != 0) {
    lVar19 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_198,*(value_type **)((long)ppvVar23 + lVar19));
      lVar19 = lVar19 + 8;
    } while (lVar22 * 8 != lVar19);
  }
  pRVar2 = (local_208->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar23 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar23 = (void **)0x0;
  }
  lVar22 = (long)(local_208->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar22 != 0) {
    lVar19 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1b8,*(value_type **)((long)ppvVar23 + lVar19));
      lVar19 = lVar19 + 8;
    } while (lVar22 * 8 != lVar19);
  }
  pTVar11 = local_208;
  convertCaffeMetadata
            ((local_208->name_).ptr_,&local_198,&local_1b8,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  pRVar21 = pTVar11->reshape_param_;
  if (pRVar21 == (ReshapeParameter *)0x0) {
    pRVar21 = (ReshapeParameter *)&caffe::_ReshapeParameter_default_instance_;
  }
  local_1c8 = pRVar21;
  if (pRVar21->axis_ != 0) {
    local_248._0_8_ = local_248 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"axis","");
    uVar18 = pRVar21->axis_;
    uVar9 = -uVar18;
    if (0 < (int)uVar18) {
      uVar9 = uVar18;
    }
    uVar20 = 1;
    if (9 < uVar9) {
      uVar17 = (ulong)uVar9;
      uVar10 = 4;
      do {
        uVar20 = uVar10;
        uVar15 = (uint)uVar17;
        if (uVar15 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_003fe275;
        }
        if (uVar15 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_003fe275;
        }
        if (uVar15 < 10000) goto LAB_003fe275;
        uVar17 = uVar17 / 10000;
        uVar10 = uVar20 + 4;
      } while (99999 < uVar15);
      uVar20 = uVar20 + 1;
    }
LAB_003fe275:
    psVar3 = (pTVar11->name_).ptr_;
    psVar4 = (pTVar11->type_).ptr_;
    local_200._0_8_ = local_200 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_200,(char)uVar20 - (char)((int)uVar18 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_200._0_8_ + (ulong)(uVar18 >> 0x1f)),uVar20,uVar9);
    unsupportedCaffeParrameterWithOption((string *)local_248,psVar3,psVar4,(string *)local_200);
    pRVar21 = local_1c8;
    pTVar11 = local_208;
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
  }
  if (pRVar21->num_axes_ != -1) {
    local_248._0_8_ = local_248 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"num_axes","");
    uVar18 = pRVar21->num_axes_;
    uVar9 = -uVar18;
    if (0 < (int)uVar18) {
      uVar9 = uVar18;
    }
    uVar20 = 1;
    if (9 < uVar9) {
      uVar17 = (ulong)uVar9;
      uVar10 = 4;
      do {
        uVar20 = uVar10;
        uVar15 = (uint)uVar17;
        if (uVar15 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_003fe39a;
        }
        if (uVar15 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_003fe39a;
        }
        if (uVar15 < 10000) goto LAB_003fe39a;
        uVar17 = uVar17 / 10000;
        uVar10 = uVar20 + 4;
      } while (99999 < uVar15);
      uVar20 = uVar20 + 1;
    }
LAB_003fe39a:
    psVar3 = (pTVar11->name_).ptr_;
    psVar4 = (pTVar11->type_).ptr_;
    local_200._0_8_ = local_200 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_200,(char)uVar20 - (char)((int)uVar18 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_200._0_8_ + (ulong)(uVar18 >> 0x1f)),uVar20,uVar9);
    unsupportedCaffeParrameterWithOption((string *)local_248,psVar3,psVar4,(string *)local_200);
    pRVar21 = local_1c8;
    pTVar11 = local_208;
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
  }
  pBVar13 = pRVar21->shape_;
  if (pBVar13 == (BlobShape *)0x0) {
    pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar13->dim_).current_size_ != 4) {
    local_248._0_8_ = local_248 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"shape size","");
    pBVar13 = pRVar21->shape_;
    if (pBVar13 == (BlobShape *)0x0) {
      pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    uVar18 = (pBVar13->dim_).current_size_;
    uVar9 = -uVar18;
    if (0 < (int)uVar18) {
      uVar9 = uVar18;
    }
    uVar20 = 1;
    if (9 < uVar9) {
      uVar17 = (ulong)uVar9;
      uVar10 = 4;
      do {
        uVar20 = uVar10;
        uVar15 = (uint)uVar17;
        if (uVar15 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_003fe4de;
        }
        if (uVar15 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_003fe4de;
        }
        if (uVar15 < 10000) goto LAB_003fe4de;
        uVar17 = uVar17 / 10000;
        uVar10 = uVar20 + 4;
      } while (99999 < uVar15);
      uVar20 = uVar20 + 1;
    }
LAB_003fe4de:
    psVar3 = (pTVar11->name_).ptr_;
    psVar4 = (pTVar11->type_).ptr_;
    local_200._0_8_ = local_200 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_200,(char)uVar20 - (char)((int)uVar18 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_200._0_8_ + (ulong)(uVar18 >> 0x1f)),uVar20,uVar9);
    unsupportedCaffeParrameterWithOption((string *)local_248,psVar3,psVar4,(string *)local_200);
    pRVar21 = local_1c8;
    pTVar11 = local_208;
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
  }
  pBVar13 = pRVar21->shape_;
  if (pBVar13 == (BlobShape *)0x0) {
    pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar13->dim_).current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_248,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_148);
  }
  if (((pBVar13->dim_).rep_)->elements[0] != 0) {
    local_248._0_8_ = local_248 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"shape dims[0]","");
    pBVar13 = pRVar21->shape_;
    if (pBVar13 == (BlobShape *)0x0) {
      pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    psVar3 = (pTVar11->name_).ptr_;
    psVar4 = (pTVar11->type_).ptr_;
    if ((pBVar13->dim_).current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_180,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    uVar17 = ((pBVar13->dim_).rep_)->elements[0];
    __val = -uVar17;
    if (0 < (long)uVar17) {
      __val = uVar17;
    }
    uVar18 = 1;
    if (9 < __val) {
      uVar16 = __val;
      uVar9 = 4;
      do {
        uVar18 = uVar9;
        if (uVar16 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_003fe6eb;
        }
        if (uVar16 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_003fe6eb;
        }
        if (uVar16 < 10000) goto LAB_003fe6eb;
        bVar8 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        uVar9 = uVar18 + 4;
      } while (bVar8);
      uVar18 = uVar18 + 1;
    }
LAB_003fe6eb:
    local_200._0_8_ = local_200 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_200,(char)uVar18 - (char)((long)uVar17 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)(local_200._0_8_ + -((long)uVar17 >> 0x3f)),uVar18,__val);
    unsupportedCaffeParrameterWithOption((string *)local_248,psVar3,psVar4,(string *)local_200);
    pRVar21 = local_1c8;
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    pTVar11 = local_208;
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
  }
  pBVar13 = pRVar21->shape_;
  if (pBVar13 == (BlobShape *)0x0) {
    pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar13->dim_).current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_248,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  if (0 < (long)(pBVar13->dim_).rep_[1].arena) {
    pBVar13 = pRVar21->shape_;
    if (pBVar13 == (BlobShape *)0x0) {
      pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    if ((pBVar13->dim_).current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_248,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    if (0 < (pBVar13->dim_).rep_[1].elements[0]) {
      pBVar13 = pRVar21->shape_;
      if (pBVar13 == (BlobShape *)0x0) {
        pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      if ((pBVar13->dim_).current_size_ < 4) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_248,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      }
      if (0 < (long)(pBVar13->dim_).rep_[2].arena) goto LAB_003fe916;
    }
  }
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"shape dims[0], dims[1], dims[2] must all be positve","");
  unsupportedCaffeParrameter((string *)local_248,(pTVar11->name_).ptr_,(pTVar11->type_).ptr_);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
LAB_003fe916:
  pTVar12 = local_1c0;
  if (local_1c0->_oneof_case_[0] != 300) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(local_1c0);
    pTVar12->_oneof_case_[0] = 300;
    this_00 = (ReshapeLayerParams *)operator_new(0x30);
    CoreML::Specification::ReshapeLayerParams::ReshapeLayerParams(this_00);
    (pTVar12->layer_).reshape_ = this_00;
  }
  pBVar13 = pRVar21->shape_;
  if (pBVar13 == (BlobShape *)0x0) {
    pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  pCVar5 = (local_1c0->layer_).convolution_;
  if ((pBVar13->dim_).current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_248,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_180);
  }
  pAVar6 = (pBVar13->dim_).rep_[1].arena;
  this = &pCVar5->kernelsize_;
  iVar1 = (pCVar5->kernelsize_).total_size_;
  if ((pCVar5->kernelsize_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,iVar1 + 1);
  }
  iVar1 = (pCVar5->kernelsize_).current_size_;
  (pCVar5->kernelsize_).current_size_ = iVar1 + 1;
  ((pCVar5->kernelsize_).rep_)->elements[iVar1] = (unsigned_long)pAVar6;
  pBVar13 = pRVar21->shape_;
  if (pBVar13 == (BlobShape *)0x0) {
    pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar13->dim_).current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_200,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_200,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_248,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_200);
  }
  uVar7 = (pBVar13->dim_).rep_[1].elements[0];
  iVar1 = (pCVar5->kernelsize_).total_size_;
  if ((pCVar5->kernelsize_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,iVar1 + 1);
  }
  iVar1 = (pCVar5->kernelsize_).current_size_;
  (pCVar5->kernelsize_).current_size_ = iVar1 + 1;
  ((pCVar5->kernelsize_).rep_)->elements[iVar1] = uVar7;
  pBVar13 = pRVar21->shape_;
  if (pBVar13 == (BlobShape *)0x0) {
    pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar13->dim_).current_size_ < 4) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_248,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_248,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_209,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_248);
  }
  pAVar6 = (pBVar13->dim_).rep_[2].arena;
  iVar1 = (pCVar5->kernelsize_).total_size_;
  if ((pCVar5->kernelsize_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,iVar1 + 1);
  }
  iVar1 = (pCVar5->kernelsize_).current_size_;
  (pCVar5->kernelsize_).current_size_ = iVar1 + 1;
  ((pCVar5->kernelsize_).rep_)->elements[iVar1] = (unsigned_long)pAVar6;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeReshape(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ReshapeParameter& caffeLayerParams = caffeLayer.reshape_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.num_axes() != -1){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("num_axes",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.num_axes()));
    }
    if (caffeLayerParams.shape().dim_size() != 4){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("shape size",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.shape().dim_size()));
    }
    if (caffeLayerParams.shape().dim(0) != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("shape dims[0]",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.shape().dim(0)));
    }
    if (!(caffeLayerParams.shape().dim(1) > 0 && caffeLayerParams.shape().dim(2) > 0 && caffeLayerParams.shape().dim(3) > 0)){
        CoreMLConverter::unsupportedCaffeParrameter("shape dims[0], dims[1], dims[2] must all be positve",caffeLayer.name(),caffeLayer.type());
    }
    //***************************************************************
    
    Specification::ReshapeLayerParams* specLayerParams = specLayer->mutable_reshape();
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(1)); //C
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(2)); //H
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(3)); //W
    
}